

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_ibs.c
# Opt level: O0

size_t bignIdSign_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t ec_d_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t in_RCX;
  ulong in_RDI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  ec_d_00 = in_RDI << 5;
  sVar1 = beltHash_keep();
  sVar2 = ecMulA_deep(in_RCX,ec_d_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sVar3 = zzMul_deep(in_RDI >> 1,in_RDI);
  sVar4 = zzMod_deep(in_RDI + (in_RDI >> 1) + 1,in_RDI);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return ec_d_00 + sVar1;
}

Assistant:

static size_t bignIdSign_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(4 * n) +
		utilMax(4,
			beltHash_keep(),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMul_deep(n / 2, n),
			zzMod_deep(n + n / 2 + 1, n));
}